

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::traversedashwordlistdashfindnext(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  int iVar1;
  pointer pDVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  requireDStackDepth(this,1,"TRAVERSE-WORDLIST-FINDNEXT");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  if (uVar3 != 0) {
    uVar6 = (ulong)uVar3;
    pDVar2 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->definitions).
                   super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 4) *
            -0x3333333333333333;
    if ((uVar6 <= uVar4 && uVar4 - uVar6 != 0) && (uVar3 - 1 != 0)) {
      iVar1 = pDVar2[uVar6].searchOrder;
      uVar6 = (ulong)(uVar3 - 1);
      lVar5 = uVar6 * 0x50 + 0x48;
      do {
        uVar6 = uVar6 - 1;
        pDVar2 = (this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = 4;
        if (((*(uint *)((long)pDVar2 + lVar5 + -0x30) & *(uint *)((long)&pDVar2->code + lVar5)) == 0
            ) && (uVar4 = 0, *(int *)((long)pDVar2 + lVar5 + -4) == iVar1)) {
          ForthStack<unsigned_int>::setTop(this_00,*(uint *)((long)pDVar2 + lVar5 + -8));
          uVar4 = 1;
        }
        if ((uVar4 & 3) != 0) goto LAB_001148aa;
        lVar5 = lVar5 + -0x50;
      } while ((int)uVar6 != 0);
      uVar4 = 0;
LAB_001148aa:
      if (uVar4 != 0) {
        return;
      }
    }
  }
  ForthStack<unsigned_int>::setTop(this_00,0);
  return;
}

Assistant:

void traversedashwordlistdashfindnext(){
					REQUIRE_DSTACK_DEPTH(1, "TRAVERSE-WORDLIST-FINDNEXT");
					auto nt = dStack.getTop(); 
					if(nt>0 && nt<definitions.size()){
						auto wid=definitions[nt].searchOrder;
						for (auto i = nt-1; i > 0 ; --i) {
							auto& defnLook = definitions[i];
							//if (!defn.isFindable())
							if (defnLook.isHidden())
								continue;
							if(defnLook.searchOrder==wid){
								dStack.setTop(defnLook.numberInVector);
								return;
							}
						}
					}
					dStack.setTop(0);	
		}